

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O2

void p2sc_idct(double *n,double *m,int N)

{
  void *__src;
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  size_t __n;
  bool bVar7;
  double dVar8;
  
  mxm(n,m,N,N,N,n);
  __n = (ulong)(uint)(N * N) << 3;
  __src = (void *)g_malloc(__n);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
  }
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    pdVar3 = n;
    for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
      dVar8 = 0.0;
      lVar6 = 0;
      uVar5 = uVar2;
      while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
        dVar8 = dVar8 + *(double *)((long)m + lVar6) * *(double *)((long)pdVar3 + lVar6);
        lVar6 = lVar6 + (long)N * 8;
      }
      *(double *)((long)__src + uVar4 * 8 + uVar1 * (long)N * 8) = dVar8;
      pdVar3 = pdVar3 + 1;
    }
    m = m + 1;
  }
  memcpy(n,__src,__n);
  g_free(__src);
  return;
}

Assistant:

void p2sc_idct(double *n, double *m, int N) {
    mxm(n, m, N, N, N, n);
    mtxm(m, n, N, N, N, n);
}